

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

void player_know_object(player *p,object *obj)

{
  object *poVar1;
  loc grid;
  char cVar2;
  _Bool _Var3;
  bool bVar4;
  char cVar5;
  int flag;
  long lVar6;
  _Bool *p_Var7;
  curse_data *pcVar8;
  ego_item *peVar9;
  angband_constants *paVar10;
  curse_data *pcVar11;
  bitflag bVar12;
  undefined2 uVar13;
  size_t sVar14;
  object *poVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char o_name [80];
  char acStack_88 [88];
  
  if (obj == (object *)0x0) {
    return;
  }
  poVar15 = obj->known;
  if (poVar15 == (object *)0x0) {
    return;
  }
  if (obj->kind != poVar15->kind) {
    return;
  }
  if ((obj->kind != (object_kind *)0x0) && ((poVar15->notice & 2) == 0)) {
    object_set_base_known(p,obj);
    return;
  }
  poVar1 = p->obj_k;
  poVar15->dd = poVar1->dd * obj->dd;
  poVar15->ds = poVar1->ds * obj->ds;
  poVar15->ac = poVar1->ac * obj->ac;
  _Var3 = tval_is_chest(obj);
  poVar15 = obj->known;
  if (!_Var3) {
    poVar15->pval = obj->pval;
  }
  poVar15->to_a = obj->to_a * p->obj_k->to_a;
  _Var3 = object_has_standard_to_h(obj);
  poVar15 = p->obj_k;
  poVar1 = obj->known;
  if (!_Var3) {
    poVar1->to_h = obj->to_h * poVar15->to_h;
  }
  poVar1->to_d = obj->to_d * poVar15->to_d;
  lVar6 = 0x29;
  do {
    if (*(short *)(poVar15->flags + lVar6 * 2 + -0x4c) == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(undefined2 *)(obj->flags + lVar6 * 2 + -0x4c);
    }
    *(undefined2 *)(poVar1->flags + lVar6 * 2 + -0x4c) = uVar13;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x3a);
  lVar6 = 0x1d;
  do {
    if (*(short *)(poVar15->flags + lVar6 * 4 + -0x4c) == 1) {
      *(undefined2 *)(poVar1->flags + lVar6 * 4 + -0x4c) =
           *(undefined2 *)(obj->flags + lVar6 * 4 + -0x4c);
      bVar12 = obj->flags[lVar6 * 4 + -0x4a];
    }
    else {
      (poVar1->flags + lVar6 * 4 + -0x4c)[0] = 'd';
      (poVar1->flags + lVar6 * 4 + -0x4c)[1] = '\0';
      bVar12 = '\0';
    }
    poVar1->flags[lVar6 * 4 + -0x4a] = bVar12;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x39);
  flag_wipe(poVar1->flags,6);
  flag = flag_next(p->obj_k->flags,6,1);
  if (flag != 0) {
    do {
      _Var3 = flag_has_dbg(obj->flags,6,flag,"obj->flags","flag");
      if (_Var3) {
        flag_on_dbg(obj->known->flags,6,flag,"obj->known->flags","flag");
      }
      flag = flag_next(p->obj_k->flags,6,flag + 1);
    } while (flag != 0);
  }
  if (obj->kind == (object_kind *)0x0) {
    return;
  }
  if (obj->brands != (_Bool *)0x0) {
    sVar14 = (size_t)z_info->brand_max;
    if (1 < z_info->brand_max) {
      uVar16 = 1;
      bVar4 = false;
      paVar10 = z_info;
LAB_001a3ff3:
      p_Var7 = p->obj_k->brands;
      do {
        if (p_Var7[uVar16] == false) {
          poVar15 = obj->known;
        }
        else {
          poVar15 = obj->known;
          if (obj->brands[uVar16] == true) goto LAB_001a4040;
        }
        if (poVar15->brands != (_Bool *)0x0) {
          poVar15->brands[uVar16] = false;
        }
        uVar16 = uVar16 + 1;
        sVar14 = (size_t)paVar10->brand_max;
        if (sVar14 <= uVar16) {
          if (!bVar4) goto LAB_001a4085;
          goto LAB_001a40a5;
        }
      } while( true );
    }
    poVar15 = obj->known;
LAB_001a4085:
    if (poVar15->brands != (_Bool *)0x0) {
      mem_free(poVar15->brands);
      obj->known->brands = (_Bool *)0x0;
    }
  }
LAB_001a40a5:
  if (obj->slays != (_Bool *)0x0) {
    sVar14 = (size_t)z_info->slay_max;
    if (1 < z_info->slay_max) {
      uVar16 = 1;
      bVar4 = false;
      paVar10 = z_info;
LAB_001a40d1:
      p_Var7 = p->obj_k->slays;
      do {
        if (p_Var7[uVar16] == false) {
          poVar15 = obj->known;
        }
        else {
          poVar15 = obj->known;
          if (obj->slays[uVar16] == true) goto LAB_001a411e;
        }
        if (poVar15->slays != (_Bool *)0x0) {
          poVar15->slays[uVar16] = false;
        }
        uVar16 = uVar16 + 1;
        sVar14 = (size_t)paVar10->slay_max;
        if (sVar14 <= uVar16) {
          if (!bVar4) goto LAB_001a4163;
          goto LAB_001a4183;
        }
      } while( true );
    }
    poVar15 = obj->known;
LAB_001a4163:
    if (poVar15->slays != (_Bool *)0x0) {
      mem_free(poVar15->slays);
      obj->known->slays = (_Bool *)0x0;
    }
  }
LAB_001a4183:
  pcVar11 = obj->curses;
  if (pcVar11 == (curse_data *)0x0) {
    pcVar11 = obj->known->curses;
    if (pcVar11 != (curse_data *)0x0) goto LAB_001a4271;
  }
  else {
    uVar16 = (ulong)z_info->curse_max;
    if (1 < z_info->curse_max) {
      uVar17 = 1;
      bVar4 = false;
      paVar10 = z_info;
LAB_001a41b3:
      pcVar8 = p->obj_k->curses;
      uVar18 = uVar17;
      do {
        uVar17 = uVar18 + 1;
        if (pcVar8[uVar18].power == L'\0') {
          poVar15 = obj->known;
        }
        else {
          poVar15 = obj->known;
          if (pcVar11[uVar18].power != L'\0') goto LAB_001a4206;
        }
        if (poVar15->curses != (curse_data *)0x0) {
          poVar15->curses[uVar18].power = L'\0';
        }
        uVar16 = (ulong)paVar10->curse_max;
        uVar18 = uVar17;
        if (uVar16 <= uVar17) {
          if (!bVar4) goto LAB_001a426a;
          goto LAB_001a4285;
        }
      } while( true );
    }
    poVar15 = obj->known;
LAB_001a426a:
    pcVar11 = poVar15->curses;
LAB_001a4271:
    mem_free(pcVar11);
    obj->known->curses = (curse_data *)0x0;
  }
LAB_001a4285:
  _Var3 = player_knows_ego(p,obj->ego,obj);
  if (_Var3) {
    peVar9 = obj->ego;
    cVar5 = peVar9->everseen;
  }
  else {
    cVar5 = '\x01';
    peVar9 = (ego_item *)0x0;
  }
  obj->known->ego = peVar9;
  _Var3 = tval_is_jewelry(obj);
  if (_Var3) {
    _Var3 = object_non_curse_runes_known(obj);
    if (!_Var3) goto LAB_001a4307;
    cVar2 = '\x01';
    if (obj->artifact == (artifact *)0x0) {
      cVar2 = obj->kind->everseen;
    }
  }
  else {
    cVar2 = '\x01';
    if (obj->kind->kidx < (uint)z_info->ordinary_kind_max) goto LAB_001a4307;
  }
  cVar5 = cVar2;
  object_flavor_aware(p,obj);
LAB_001a4307:
  if ((((obj->kind->aware == true) && (obj->kind->flavor != (flavor *)0x0)) ||
      ((_Var3 = tval_is_wearable(obj), !_Var3 && (obj->kind->flavor == (flavor *)0x0)))) ||
     (((_Var3 = tval_is_wearable(obj), _Var3 && (obj->kind->effect != (effect *)0x0)) &&
      (obj->kind->aware == true)))) {
    obj->known->effect = obj->effect;
  }
  if (cVar5 == '\0') {
    _Var3 = object_is_carried(p,obj);
    if (_Var3) {
      object_desc(acStack_88,0x50,obj,0x43,p);
      cVar5 = gear_to_label(p,obj);
      msg("You have %s (%c).",acStack_88,(ulong)(uint)(int)cVar5);
    }
    else if ((cave != (chunk_conflict *)0x0) &&
            (grid.x = (p->grid).x, grid.y = (p->grid).y, _Var3 = square_holds_object(cave,grid,obj),
            _Var3)) {
      object_desc(acStack_88,0x50,obj,0x43,p);
      msg("On the ground: %s.",acStack_88);
    }
  }
  _Var3 = object_runes_known(obj);
  if ((_Var3) && (poVar15 = obj->known, obj->effect == poVar15->effect)) {
    lVar6 = 0;
    do {
      poVar15->el_info[lVar6].res_level = obj->el_info[lVar6].res_level;
      poVar15->el_info[lVar6].flags = obj->el_info[lVar6].flags;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1c);
    flag_wipe(poVar15->flags,6);
    flag_copy(obj->known->flags,obj->flags,6);
  }
  return;
LAB_001a4040:
  p_Var7 = poVar15->brands;
  if (p_Var7 == (_Bool *)0x0) {
    p_Var7 = (_Bool *)mem_zalloc(sVar14);
    obj->known->brands = p_Var7;
    paVar10 = z_info;
  }
  p_Var7[uVar16] = true;
  uVar16 = uVar16 + 1;
  sVar14 = (size_t)paVar10->brand_max;
  bVar4 = true;
  if (sVar14 <= uVar16) goto LAB_001a40a5;
  goto LAB_001a3ff3;
LAB_001a411e:
  p_Var7 = poVar15->slays;
  if (p_Var7 == (_Bool *)0x0) {
    p_Var7 = (_Bool *)mem_zalloc(sVar14);
    obj->known->slays = p_Var7;
    paVar10 = z_info;
  }
  p_Var7[uVar16] = true;
  uVar16 = uVar16 + 1;
  sVar14 = (size_t)paVar10->slay_max;
  bVar4 = true;
  if (sVar14 <= uVar16) goto LAB_001a4183;
  goto LAB_001a40d1;
LAB_001a4206:
  pcVar8 = poVar15->curses;
  if (pcVar8 == (curse_data *)0x0) {
    pcVar8 = (curse_data *)mem_zalloc((ulong)(uint)((int)uVar16 << 3));
    obj->known->curses = pcVar8;
    pcVar11 = obj->curses;
    paVar10 = z_info;
  }
  pcVar8[uVar18].power = pcVar11[uVar18].power;
  uVar16 = (ulong)paVar10->curse_max;
  bVar4 = true;
  if (uVar16 <= uVar17) goto LAB_001a4285;
  goto LAB_001a41b3;
}

Assistant:

void player_know_object(struct player *p, struct object *obj)
{
	int i, flag;
	bool seen = true;

	/* Unseen or only sensed objects don't get any ID */
	if (!obj) return;
	if (!obj->known) return;
	if (obj->kind != obj->known->kind) return;

	/* Distant objects just get base properties */
	if (obj->kind && !(obj->known->notice & OBJ_NOTICE_ASSESSED)) {
		object_set_base_known(p, obj);
		return;
	}

	/* Get the dice, and the pval for anything but chests */
	obj->known->dd = obj->dd * p->obj_k->dd;
	obj->known->ds = obj->ds * p->obj_k->ds;
	obj->known->ac = obj->ac * p->obj_k->ac;
	if (!tval_is_chest(obj))
		obj->known->pval = obj->pval;

	/* Set combat details */
	obj->known->to_a = p->obj_k->to_a * obj->to_a;
	if (!object_has_standard_to_h(obj))
		obj->known->to_h = p->obj_k->to_h * obj->to_h;
	obj->known->to_d = p->obj_k->to_d * obj->to_d;

	/* Set modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if (p->obj_k->modifiers[i]) {
			obj->known->modifiers[i] = obj->modifiers[i];
		} else {
			obj->known->modifiers[i] = 0;
		}
	}

	/* Set elements */
	for (i = 0; i < ELEM_MAX; i++) {
		if (p->obj_k->el_info[i].res_level == 1) {
			obj->known->el_info[i].res_level = obj->el_info[i].res_level;
			obj->known->el_info[i].flags = obj->el_info[i].flags;
		} else {
			obj->known->el_info[i].res_level = RES_LEVEL_BASE;
			obj->known->el_info[i].flags = 0;
		}
	}

	/* Set object flags */
	of_wipe(obj->known->flags);
	for (flag = of_next(p->obj_k->flags, FLAG_START); flag != FLAG_END;
		 flag = of_next(p->obj_k->flags, flag + 1)) {
		if (of_has(obj->flags, flag)) {
			of_on(obj->known->flags, flag);
		}
	}

	/* Curse object structures are finished now */
	if (!obj->kind) {
		return;
	}

	/* Set brands */
	if (obj->brands) {
		bool known_brand = false;

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_knows_brand(p, i) && obj->brands[i]) {
				if (!obj->known->brands) {
					obj->known->brands = mem_zalloc(
						z_info->brand_max *
						sizeof(bool));
				}
				obj->known->brands[i] = true;
				known_brand = true;
			} else if (obj->known->brands) {
				obj->known->brands[i] = false;
			}
		}
		if (!known_brand && obj->known->brands) {
			mem_free(obj->known->brands);
			obj->known->brands = NULL;
		}
	}

	/* Set slays */
	if (obj->slays) {
		bool known_slay = false;

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_knows_slay(p, i) && obj->slays[i]) {
				if (!obj->known->slays) {
					obj->known->slays = mem_zalloc(
						z_info->slay_max *
						sizeof(bool));
				}
				obj->known->slays[i] = true;
				known_slay = true;
			} else if (obj->known->slays) {
				obj->known->slays[i] = false;
			}
		}
		if (!known_slay && obj->known->slays) {
			mem_free(obj->known->slays);
			obj->known->slays = NULL;
		}
	}

	/* Set curses - be very careful to keep knowledge aligned */
	if (obj->curses) {
		bool known_cursed = false;
		for (i = 1; i < z_info->curse_max; i++) {
			if (p->obj_k->curses[i].power && obj->curses[i].power) {
				if (!obj->known->curses) {
					obj->known->curses = mem_zalloc(z_info->curse_max *
													sizeof(struct curse_data));
				}
				obj->known->curses[i].power = obj->curses[i].power;
				known_cursed = true;
			} else if (obj->known->curses) {
				obj->known->curses[i].power = 0;
			}
		}
		if (!known_cursed) {
			mem_free(obj->known->curses);
			obj->known->curses = NULL;
		}
	} else if (obj->known->curses) {
		mem_free(obj->known->curses);
		obj->known->curses = NULL;
	}

	/* Set ego type, jewellery type if known */
	if (player_knows_ego(p, obj->ego, obj)) {
		seen = obj->ego->everseen;
		obj->known->ego = obj->ego;
	} else {
		obj->known->ego = NULL;
	}

	if (tval_is_jewelry(obj)) {
		if (object_non_curse_runes_known(obj)) {
			seen = (obj->artifact) ? true : obj->kind->everseen;
			object_flavor_aware(p, obj);
		}
	} else if (obj->kind->kidx >= z_info->ordinary_kind_max) {
		/*
		 * Become aware if it is a special artifact that isn't
		 * jewelry.
		 */
		seen = true;
		object_flavor_aware(p, obj);
	}

	/* Ensure effect is known as if object_set_base_known() had been called. */
	if ((obj->kind->aware && obj->kind->flavor) ||
		(!tval_is_wearable(obj) && !obj->kind->flavor) ||
		(tval_is_wearable(obj) && obj->kind->effect && obj->kind->aware)) {
		obj->known->effect = obj->effect;
	}

	/* Report on new stuff */
	if (!seen) {
		char o_name[80];

		/* Describe the object if it's available */
		if (object_is_carried(p, obj)) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);
			msg("You have %s (%c).", o_name, gear_to_label(p, obj));
		} else if (cave && square_holds_object(cave, p->grid, obj)) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);
			msg("On the ground: %s.", o_name);
		}
	}

	/* Fully known objects have their known element and flag info set to 
	 * match the actual info, rather than showing what elements and flags
	 * the would be displaying if they had them */
	if (object_fully_known(obj)) {
		for (i = 0; i < ELEM_MAX; i++) {
			obj->known->el_info[i].res_level = obj->el_info[i].res_level;
			obj->known->el_info[i].flags = obj->el_info[i].flags;
		}
		of_wipe(obj->known->flags);
		of_copy(obj->known->flags, obj->flags);
	}
}